

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::EdgeChainSimplifier::EdgeChainSimplifier
          (EdgeChainSimplifier *this,S2Builder *builder,Graph *g,
          vector<int,_std::allocator<int>_> *edge_layers,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices,
          vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *layer_edges,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *layer_input_edge_ids,IdSetLexicon *input_edge_id_set_lexicon)

{
  allocator_type local_5c;
  allocator_type local_5b;
  bool local_5a;
  bool local_59;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  VertexInMap *local_38;
  
  this->builder_ = builder;
  this->g_ = g;
  local_38 = &this->in_;
  Graph::VertexInMap::VertexInMap(local_38,g);
  Graph::VertexOutMap::VertexOutMap(&this->out_,g);
  std::vector<int,_std::allocator<int>_>::vector(&this->edge_layers_,edge_layers);
  this->site_vertices_ = site_vertices;
  this->layer_edges_ = layer_edges;
  this->layer_input_edge_ids_ = layer_input_edge_ids;
  this->input_edge_id_set_lexicon_ = input_edge_id_set_lexicon;
  this->layer_begins_ = &this->builder_->layer_begins_;
  local_5a = false;
  local_40 = &this->edge_layers_;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->is_interior_,(long)g->num_vertices_,&local_5a,&local_5b);
  local_59 = false;
  local_48 = &this->is_interior_;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->used_,
             (long)(int)((ulong)((long)(g->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(g->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),&local_59,
             &local_5c);
  local_50 = &this->tmp_vertices_;
  local_58 = &this->tmp_edges_;
  (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (&this->new_edges_,
             (long)(int)((ulong)((long)(g->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(g->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3));
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->new_input_edge_ids_,
             (long)(int)((ulong)((long)(g->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(g->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3));
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->new_edge_layers_,
             (long)(int)((ulong)((long)(g->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(g->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3));
  return;
}

Assistant:

S2Builder::EdgeChainSimplifier::EdgeChainSimplifier(
    const S2Builder& builder, const Graph& g, const vector<int>& edge_layers,
    const vector<compact_array<InputVertexId>>& site_vertices,
    vector<vector<Edge>>* layer_edges,
    vector<vector<InputEdgeIdSetId>>* layer_input_edge_ids,
    IdSetLexicon* input_edge_id_set_lexicon)
    : builder_(builder), g_(g), in_(g), out_(g), edge_layers_(edge_layers),
      site_vertices_(site_vertices), layer_edges_(layer_edges),
      layer_input_edge_ids_(layer_input_edge_ids),
      input_edge_id_set_lexicon_(input_edge_id_set_lexicon),
      layer_begins_(builder_.layer_begins_),
      is_interior_(g.num_vertices()), used_(g.num_edges()) {
  new_edges_.reserve(g.num_edges());
  new_input_edge_ids_.reserve(g.num_edges());
  new_edge_layers_.reserve(g.num_edges());
}